

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O3

LexToken lex_scan(LexState *ls,TValue *tv)

{
  SBuf *sb;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  GCstr *pGVar5;
  byte *pbVar6;
  byte bVar7;
  uint32_t uVar8;
  ErrMsg em;
  LexToken tok;
  ulong uVar9;
  int iVar10;
  
  sb = &ls->sb;
  (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
  uVar9 = (ulong)ls->c;
  bVar7 = ""[uVar9 + 1];
  do {
    if ((char)bVar7 < '\0') {
      if ((bVar7 & 8) == 0) {
        do {
          uVar1 = (ls->sb).p.ptr32;
          pcVar4 = (char *)(ulong)uVar1;
          if ((ls->sb).e.ptr32 == uVar1) {
            pcVar4 = lj_buf_more2(sb,1);
          }
          *pcVar4 = (char)uVar9;
          (ls->sb).p.ptr32 = (int)pcVar4 + 1;
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar9 = (ulong)*pbVar6;
          }
          else {
            uVar1 = lex_more(ls);
            uVar9 = (ulong)uVar1;
          }
          ls->c = (int)uVar9;
        } while ((char)""[(long)(int)uVar9 + 1] < '\0');
        uVar1 = (ls->sb).b.ptr32;
        pGVar5 = lj_parse_keepstr(ls,(char *)(ulong)uVar1,(ulong)((ls->sb).p.ptr32 - uVar1));
        (tv->u32).lo = (uint32_t)pGVar5;
        (tv->field_2).it = 0xfffffffb;
        if (pGVar5->reserved == 0) {
          uVar1 = 0x11f;
        }
        else {
          uVar1 = pGVar5->reserved | 0x100;
        }
      }
      else {
LAB_0012a480:
        lex_number(ls,tv);
        uVar1 = 0x11e;
      }
      return uVar1;
    }
    uVar1 = (uint)uVar9;
    if ((int)uVar1 < 0xd) {
      if (((int)uVar1 < 0xb) && (uVar1 != 9)) {
        if (uVar1 != 10) {
          if (uVar1 == 0xffffffff) {
            return 0x121;
          }
          goto switchD_00129b9a_caseD_3b;
        }
LAB_00129a15:
        lex_newline(ls);
      }
      else {
LAB_001299ee:
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar1 = (uint)*pbVar6;
        }
        else {
          uVar1 = lex_more(ls);
        }
        ls->c = uVar1;
      }
    }
    else {
      if ((int)uVar1 < 0x27) {
        if (uVar1 != 0xd) {
          if (uVar1 != 0x20) {
            if (uVar1 != 0x22) goto switchD_00129b9a_caseD_3b;
            goto LAB_00129c1f;
          }
          goto LAB_001299ee;
        }
        goto LAB_00129a15;
      }
      if (0x2d < (int)uVar1) {
        if ((int)uVar1 < 0x5b) {
          switch(uVar1) {
          case 0x3a:
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar1 = (uint)*pbVar6;
            }
            else {
              uVar1 = lex_more(ls);
            }
            ls->c = uVar1;
            if (uVar1 == 0x3a) {
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar1 = (uint)*pbVar6;
              }
              else {
                uVar1 = lex_more(ls);
              }
              ls->c = uVar1;
              return 0x11d;
            }
            return 0x3a;
          case 0x3b:
            break;
          case 0x3c:
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar1 = (uint)*pbVar6;
            }
            else {
              uVar1 = lex_more(ls);
            }
            ls->c = uVar1;
            if (uVar1 == 0x3d) {
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar1 = (uint)*pbVar6;
              }
              else {
                uVar1 = lex_more(ls);
              }
              ls->c = uVar1;
              return 0x11b;
            }
            return 0x3c;
          case 0x3d:
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar1 = (uint)*pbVar6;
            }
            else {
              uVar1 = lex_more(ls);
            }
            ls->c = uVar1;
            if (uVar1 == 0x3d) {
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar1 = (uint)*pbVar6;
              }
              else {
                uVar1 = lex_more(ls);
              }
              ls->c = uVar1;
              return 0x119;
            }
            return 0x3d;
          case 0x3e:
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar1 = (uint)*pbVar6;
            }
            else {
              uVar1 = lex_more(ls);
            }
            ls->c = uVar1;
            if (uVar1 == 0x3d) {
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar1 = (uint)*pbVar6;
              }
              else {
                uVar1 = lex_more(ls);
              }
              ls->c = uVar1;
              return 0x11a;
            }
            return 0x3e;
          default:
            if (uVar1 == 0x2e) {
              uVar1 = (ls->sb).p.ptr32;
              pcVar4 = (char *)(ulong)uVar1;
              if ((ls->sb).e.ptr32 == uVar1) {
                pcVar4 = lj_buf_more2(sb,1);
              }
              *pcVar4 = '.';
              (ls->sb).p.ptr32 = (int)pcVar4 + 1;
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar1 = (uint)*pbVar6;
              }
              else {
                uVar1 = lex_more(ls);
              }
              ls->c = uVar1;
              if (uVar1 == 0x2e) {
                pbVar6 = (byte *)ls->p;
                if (pbVar6 < ls->pe) {
                  ls->p = (char *)(pbVar6 + 1);
                  uVar1 = (uint)*pbVar6;
                }
                else {
                  uVar1 = lex_more(ls);
                }
                ls->c = uVar1;
                if (uVar1 == 0x2e) {
                  pbVar6 = (byte *)ls->p;
                  if (pbVar6 < ls->pe) {
                    ls->p = (char *)(pbVar6 + 1);
                    uVar1 = (uint)*pbVar6;
                  }
                  else {
                    uVar1 = lex_more(ls);
                  }
                  ls->c = uVar1;
                  return 0x118;
                }
                return 0x117;
              }
              if ((""[(long)(int)uVar1 + 1] & 8) == 0) {
                return 0x2e;
              }
              goto LAB_0012a480;
            }
          }
        }
        else {
          if (uVar1 == 0x5b) {
            iVar10 = lex_skipeq(ls);
            if (-1 < iVar10) {
              lex_longstring(ls,tv,iVar10);
              return 0x120;
            }
            if (iVar10 == -1) {
              return 0x5b;
            }
            tok = 0x120;
            em = LJ_ERR_XLDELIM;
LAB_0012a5d1:
            lj_lex_error(ls,tok,em);
          }
          if (uVar1 == 0x7e) {
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar1 = (uint)*pbVar6;
            }
            else {
              uVar1 = lex_more(ls);
            }
            ls->c = uVar1;
            if (uVar1 == 0x3d) {
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar1 = (uint)*pbVar6;
              }
              else {
                uVar1 = lex_more(ls);
              }
              ls->c = uVar1;
              return 0x11c;
            }
            return 0x7e;
          }
        }
switchD_00129b9a_caseD_3b:
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar3 = (uint)*pbVar6;
        }
        else {
          uVar3 = lex_more(ls);
        }
        ls->c = uVar3;
        return uVar1;
      }
      if (uVar1 != 0x2d) {
        if (uVar1 != 0x27) goto switchD_00129b9a_caseD_3b;
LAB_00129c1f:
        uVar3 = (ls->sb).p.ptr32;
        pcVar4 = (char *)(ulong)uVar3;
        if ((ls->sb).e.ptr32 == uVar3) {
          pcVar4 = lj_buf_more2(sb,1);
        }
        iVar10 = (int)pcVar4;
        *pcVar4 = (char)uVar9;
        break;
      }
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar1 = (uint)*pbVar6;
      }
      else {
        uVar1 = lex_more(ls);
      }
      ls->c = uVar1;
      if (uVar1 != 0x2d) {
        return 0x2d;
      }
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar1 = (uint)*pbVar6;
      }
      else {
        uVar1 = lex_more(ls);
      }
      ls->c = uVar1;
      if (uVar1 == 0x5b) {
        iVar10 = lex_skipeq(ls);
        (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
        if (-1 < iVar10) {
          lex_longstring(ls,(TValue *)0x0,iVar10);
          (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
          goto LAB_00129add;
        }
        uVar1 = ls->c;
      }
      while ((0xe < uVar1 + 1 || ((0x4801U >> (uVar1 + 1 & 0x1f) & 1) == 0))) {
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar1 = (uint)*pbVar6;
        }
        else {
          uVar1 = lex_more(ls);
        }
        ls->c = uVar1;
      }
    }
LAB_00129add:
    uVar9 = (ulong)ls->c;
    bVar7 = ""[uVar9 + 1];
  } while( true );
LAB_00129c31:
  (ls->sb).p.ptr32 = iVar10 + 1;
  pbVar6 = (byte *)ls->p;
  if (pbVar6 < ls->pe) {
    ls->p = (char *)(pbVar6 + 1);
    uVar3 = (uint)*pbVar6;
  }
  else {
    uVar3 = lex_more(ls);
  }
  ls->c = uVar3;
  while( true ) {
    if (uVar3 == uVar1) {
      uVar1 = (ls->sb).p.ptr32;
      pcVar4 = (char *)(ulong)uVar1;
      if ((ls->sb).e.ptr32 == uVar1) {
        pcVar4 = lj_buf_more2(sb,1);
      }
      uVar8 = (int)pcVar4 + 1;
      *pcVar4 = (char)uVar9;
      (ls->sb).p.ptr32 = uVar8;
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar1 = (uint)*pbVar6;
      }
      else {
        uVar1 = lex_more(ls);
        uVar8 = (ls->sb).p.ptr32;
      }
      ls->c = uVar1;
      uVar1 = (ls->sb).b.ptr32;
      pGVar5 = lj_parse_keepstr(ls,(char *)((ulong)uVar1 + 1),(ulong)((uVar8 - uVar1) - 2));
      (tv->u32).lo = (uint32_t)pGVar5;
      (tv->field_2).it = 0xfffffffb;
      return 0x120;
    }
    if ((int)uVar3 < 0x5c) break;
    if (uVar3 != 0x5c) goto LAB_0012a1bf;
    pbVar6 = (byte *)ls->p;
    if (pbVar6 < ls->pe) {
      ls->p = (char *)(pbVar6 + 1);
      uVar3 = (uint)*pbVar6;
    }
    else {
      uVar3 = lex_more(ls);
    }
    ls->c = uVar3;
    if ((int)uVar3 < 0x62) {
      if (0x21 < (int)uVar3) {
        if ((int)uVar3 < 0x5c) {
          if ((uVar3 != 0x22) && (uVar3 != 0x27)) goto switchD_00129ce8_caseD_6f;
        }
        else if (uVar3 != 0x5c) {
          if (uVar3 != 0x61) goto switchD_00129ce8_caseD_6f;
          uVar3 = 7;
        }
        goto LAB_0012a0b6;
      }
      if (uVar3 != 0xffffffff) {
        if ((uVar3 != 10) && (uVar3 != 0xd)) goto switchD_00129ce8_caseD_6f;
        uVar3 = (ls->sb).p.ptr32;
        pcVar4 = (char *)(ulong)uVar3;
        if ((ls->sb).e.ptr32 == uVar3) {
          pcVar4 = lj_buf_more2(sb,1);
        }
        *pcVar4 = '\n';
        (ls->sb).p.ptr32 = (int)pcVar4 + 1;
        lex_newline(ls);
      }
    }
    else {
      switch(uVar3) {
      case 0x6e:
        uVar3 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
      case 0x79:
switchD_00129ce8_caseD_6f:
        if ((""[(long)(int)uVar3 + 1] & 8) != 0) {
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar2 = (uint)*pbVar6;
          }
          else {
            uVar2 = lex_more(ls);
          }
          iVar10 = uVar3 - 0x30;
          ls->c = uVar2;
          if ((""[(long)(int)uVar2 + 1] & 8) != 0) {
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar3 = (uint)*pbVar6;
            }
            else {
              uVar3 = lex_more(ls);
            }
            iVar10 = (uVar2 - 0x30) + iVar10 * 10;
            ls->c = uVar3;
            if ((""[(long)(int)uVar3 + 1] & 8) != 0) {
              iVar10 = uVar3 + iVar10 * 10 + -0x30;
              if (0xff < iVar10) goto LAB_0012a5ab;
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar3 = (uint)*pbVar6;
              }
              else {
                uVar3 = lex_more(ls);
              }
              ls->c = uVar3;
            }
          }
          uVar3 = (ls->sb).p.ptr32;
          pcVar4 = (char *)(ulong)uVar3;
          if ((ls->sb).e.ptr32 == uVar3) {
            pcVar4 = lj_buf_more2(sb,1);
          }
          *pcVar4 = (char)iVar10;
          (sb->p).ptr32 = (int)pcVar4 + 1;
          goto LAB_0012a0e9;
        }
LAB_0012a5ab:
        tok = 0x120;
        em = LJ_ERR_XESC;
        goto LAB_0012a5d1;
      case 0x72:
        uVar3 = 0xd;
        break;
      case 0x74:
        uVar3 = 9;
        break;
      case 0x75:
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar3 = (uint)*pbVar6;
        }
        else {
          uVar3 = lex_more(ls);
        }
        ls->c = uVar3;
        if (uVar3 != 0x7b) goto LAB_0012a5ab;
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar2 = (uint)*pbVar6;
        }
        else {
          uVar2 = lex_more(ls);
        }
        ls->c = uVar2;
        uVar3 = 0;
        do {
          uVar3 = uVar2 & 0xf | uVar3 << 4;
          if ((""[(long)(int)uVar2 + 1] & 8) == 0) {
            if ((""[(long)(int)uVar2 + 1] & 0x10) == 0) goto LAB_0012a5ab;
            uVar3 = uVar3 + 9;
          }
          if (0x10ffff < (int)uVar3) goto LAB_0012a5ab;
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar2 = (uint)*pbVar6;
          }
          else {
            uVar2 = lex_more(ls);
          }
          ls->c = uVar2;
        } while (uVar2 != 0x7d);
        if ((int)uVar3 < 0x800) {
          if ((int)uVar3 < 0x80) break;
          uVar2 = (ls->sb).p.ptr32;
          pbVar6 = (byte *)(ulong)uVar2;
          if ((ls->sb).e.ptr32 == uVar2) {
            pbVar6 = (byte *)lj_buf_more2(sb,1);
          }
          bVar7 = (byte)(uVar3 >> 6) | 0xc0;
        }
        else {
          if (uVar3 < 0x10000) {
            if ((uVar3 & 0xf800) == 0xd800) goto LAB_0012a5ab;
            uVar2 = (ls->sb).p.ptr32;
            pbVar6 = (byte *)(ulong)uVar2;
            if ((ls->sb).e.ptr32 == uVar2) {
              pbVar6 = (byte *)lj_buf_more2(sb,1);
            }
            bVar7 = (byte)(uVar3 >> 0xc) | 0xe0;
          }
          else {
            uVar2 = (ls->sb).p.ptr32;
            pbVar6 = (byte *)(ulong)uVar2;
            if ((ls->sb).e.ptr32 == uVar2) {
              pbVar6 = (byte *)lj_buf_more2(sb,1);
            }
            *pbVar6 = (byte)(uVar3 >> 0x12) | 0xf0;
            uVar8 = (uint32_t)(pbVar6 + 1);
            (ls->sb).p.ptr32 = uVar8;
            if ((ls->sb).e.ptr32 == uVar8) {
              pbVar6 = (byte *)lj_buf_more2(sb,1);
            }
            else {
              pbVar6 = (byte *)((ulong)(pbVar6 + 1) & 0xffffffff);
            }
            bVar7 = (byte)(uVar3 >> 0xc) & 0x3f | 0x80;
          }
          *pbVar6 = bVar7;
          uVar8 = (uint32_t)(pbVar6 + 1);
          (ls->sb).p.ptr32 = uVar8;
          if ((ls->sb).e.ptr32 == uVar8) {
            pbVar6 = (byte *)lj_buf_more2(sb,1);
          }
          else {
            pbVar6 = (byte *)((ulong)(pbVar6 + 1) & 0xffffffff);
          }
          bVar7 = (byte)(uVar3 >> 6) & 0x3f | 0x80;
        }
        *pbVar6 = bVar7;
        (sb->p).ptr32 = (int)pbVar6 + 1;
        uVar3 = uVar3 & 0x3f | 0x80;
        break;
      case 0x76:
        uVar3 = 0xb;
        break;
      case 0x78:
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar3 = (uint)*pbVar6;
        }
        else {
          uVar3 = lex_more(ls);
        }
        ls->c = uVar3;
        iVar10 = (uVar3 & 0xf) * 0x10;
        if ((""[(long)(int)uVar3 + 1] & 8) == 0) {
          if ((""[(long)(int)uVar3 + 1] & 0x10) == 0) goto LAB_0012a5ab;
          iVar10 = iVar10 + 0x90;
        }
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar2 = (uint)*pbVar6;
        }
        else {
          uVar2 = lex_more(ls);
        }
        ls->c = uVar2;
        uVar3 = (uVar2 & 0xf) + iVar10;
        if ((""[(long)(int)uVar2 + 1] & 8) == 0) {
          if ((""[(long)(int)uVar2 + 1] & 0x10) == 0) goto LAB_0012a5ab;
          uVar3 = uVar3 + 9;
        }
        break;
      case 0x7a:
        do {
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar3 = (uint)*pbVar6;
          }
          else {
            uVar3 = lex_more(ls);
          }
          ls->c = uVar3;
          while( true ) {
            if ((""[(long)(int)uVar3 + 1] & 2) == 0) goto LAB_0012a0e9;
            if ((uVar3 != 0xd) && (uVar3 != 10)) break;
            lex_newline(ls);
            uVar3 = ls->c;
          }
        } while( true );
      default:
        if (uVar3 == 0x62) {
          uVar3 = 8;
        }
        else {
          if (uVar3 != 0x66) goto switchD_00129ce8_caseD_6f;
          uVar3 = 0xc;
        }
      }
LAB_0012a0b6:
      uVar2 = (ls->sb).p.ptr32;
      pcVar4 = (char *)(ulong)uVar2;
      if ((ls->sb).e.ptr32 == uVar2) {
        pcVar4 = lj_buf_more2(sb,1);
      }
      *pcVar4 = (char)uVar3;
      (ls->sb).p.ptr32 = (int)pcVar4 + 1;
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar3 = (uint)*pbVar6;
      }
      else {
        uVar3 = lex_more(ls);
      }
      ls->c = uVar3;
    }
LAB_0012a0e9:
    uVar3 = ls->c;
  }
  if (uVar3 == 0xffffffff) {
    tok = 0x121;
    goto LAB_0012a5cc;
  }
  if ((uVar3 == 10) || (uVar3 == 0xd)) {
    tok = 0x120;
LAB_0012a5cc:
    em = LJ_ERR_XSTR;
    goto LAB_0012a5d1;
  }
LAB_0012a1bf:
  uVar2 = (ls->sb).p.ptr32;
  pcVar4 = (char *)(ulong)uVar2;
  if ((ls->sb).e.ptr32 == uVar2) {
    pcVar4 = lj_buf_more2(sb,1);
  }
  iVar10 = (int)pcVar4;
  *pcVar4 = (char)uVar3;
  goto LAB_00129c31;
}

Assistant:

static LexToken lex_scan(LexState *ls, TValue *tv)
{
  lj_buf_reset(&ls->sb);
  for (;;) {
    if (lj_char_isident(ls->c)) {
      GCstr *s;
      if (lj_char_isdigit(ls->c)) {  /* Numeric literal. */
	lex_number(ls, tv);
	return TK_number;
      }
      /* Identifier or reserved word. */
      do {
	lex_savenext(ls);
      } while (lj_char_isident(ls->c));
      s = lj_parse_keepstr(ls, sbufB(&ls->sb), sbuflen(&ls->sb));
      setstrV(ls->L, tv, s);
      if (s->reserved > 0)  /* Reserved word? */
	return TK_OFS + s->reserved;
      return TK_name;
    }
    switch (ls->c) {
    case '\n':
    case '\r':
      lex_newline(ls);
      continue;
    case ' ':
    case '\t':
    case '\v':
    case '\f':
      lex_next(ls);
      continue;
    case '-':
      lex_next(ls);
      if (ls->c != '-') return '-';
      lex_next(ls);
      if (ls->c == '[') {  /* Long comment "--[=*[...]=*]". */
	int sep = lex_skipeq(ls);
	lj_buf_reset(&ls->sb);  /* `lex_skipeq' may dirty the buffer */
	if (sep >= 0) {
	  lex_longstring(ls, NULL, sep);
	  lj_buf_reset(&ls->sb);
	  continue;
	}
      }
      /* Short comment "--.*\n". */
      while (!lex_iseol(ls) && ls->c != LEX_EOF)
	lex_next(ls);
      continue;
    case '[': {
      int sep = lex_skipeq(ls);
      if (sep >= 0) {
	lex_longstring(ls, tv, sep);
	return TK_string;
      } else if (sep == -1) {
	return '[';
      } else {
	lj_lex_error(ls, TK_string, LJ_ERR_XLDELIM);
	continue;
      }
      }
    case '=':
      lex_next(ls);
      if (ls->c != '=') return '='; else { lex_next(ls); return TK_eq; }
    case '<':
      lex_next(ls);
      if (ls->c != '=') return '<'; else { lex_next(ls); return TK_le; }
    case '>':
      lex_next(ls);
      if (ls->c != '=') return '>'; else { lex_next(ls); return TK_ge; }
    case '~':
      lex_next(ls);
      if (ls->c != '=') return '~'; else { lex_next(ls); return TK_ne; }
    case ':':
      lex_next(ls);
      if (ls->c != ':') return ':'; else { lex_next(ls); return TK_label; }
    case '"':
    case '\'':
      lex_string(ls, tv);
      return TK_string;
    case '.':
      if (lex_savenext(ls) == '.') {
	lex_next(ls);
	if (ls->c == '.') {
	  lex_next(ls);
	  return TK_dots;   /* ... */
	}
	return TK_concat;   /* .. */
      } else if (!lj_char_isdigit(ls->c)) {
	return '.';
      } else {
	lex_number(ls, tv);
	return TK_number;
      }
    case LEX_EOF:
      return TK_eof;
    default: {
      LexChar c = ls->c;
      lex_next(ls);
      return c;  /* Single-char tokens (+ - / ...). */
    }
    }
  }
}